

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

long __thiscall
TPZMatrix<long>::ConditionNumber(TPZMatrix<long> *this,int p,int64_t numiter,REAL tol)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  long invnorm;
  long thisnorm;
  TPZFMatrix<long> Inv;
  REAL localtol;
  int64_t localnumiter;
  undefined4 in_stack_00000100;
  int in_stack_00000114;
  TPZMatrix<long> *in_stack_00000118;
  undefined8 in_stack_ffffffffffffff18;
  DecomposeType dec;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  TPZMatrix<long> *in_stack_ffffffffffffff28;
  long local_8;
  
  dec = (DecomposeType)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  TPZFMatrix<long>::TPZFMatrix
            ((TPZFMatrix<long> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_8 = MatrixNorm(in_stack_00000118,in_stack_00000114,(int64_t)this,
                       (REAL)CONCAT44(p,in_stack_00000100));
  iVar1 = Inverse(in_stack_ffffffffffffff28,
                  (TPZFMatrix<long> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                  dec);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TVar TPZMatrix<long>::ConditionNumber(int, int64_t, REAL) [T = long]")
    ;
    poVar2 = std::operator<<(poVar2," - it was not possible to compute the inverse matrix.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_8 = 0;
  }
  else {
    lVar3 = MatrixNorm(in_stack_00000118,in_stack_00000114,(int64_t)this,
                       (REAL)CONCAT44(p,in_stack_00000100));
    local_8 = local_8 * lVar3;
  }
  TPZFMatrix<long>::~TPZFMatrix((TPZFMatrix<long> *)0x12e61be);
  return local_8;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}